

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniformGradient.cpp
# Opt level: O2

void __thiscall OpenMD::UniformGradient::UniformGradient(UniformGradient *this,SimInfo *info)

{
  (this->super_ForceModifier).info_ = info;
  (this->super_ForceModifier)._vptr_ForceModifier = (_func_int **)&PTR__UniformGradient_002778b0;
  this->initialized = false;
  this->doUniformGradient = false;
  this->doParticlePot = false;
  SquareMatrix<double,_3>::SquareMatrix(&(this->Grad_).super_SquareMatrix<double,_3>);
  Vector<double,_3U>::Vector(&(this->a_).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->b_).super_Vector<double,_3U>);
  this->g_ = 0.0;
  this->cpsi_ = 0.0;
  this->simParams = ((this->super_ForceModifier).info_)->simParams_;
  return;
}

Assistant:

UniformGradient::UniformGradient(SimInfo* info) :
      ForceModifier {info}, initialized {false}, doUniformGradient {false},
      doParticlePot {false} {
    simParams = info_->getSimParams();
  }